

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundaryElementModel.cpp
# Opt level: O0

size_t __thiscall OpenMD::BoundaryElementModel::assignElements(BoundaryElementModel *this)

{
  ulong uVar1;
  long in_RDI;
  Mesh *in_stack_000001b8;
  BoundaryElementModel *in_stack_000001c0;
  size_type local_8;
  
  if (*(long *)(in_RDI + 8) == 0) {
    local_8 = 0;
  }
  else {
    uVar1 = (**(code **)(**(long **)(in_RDI + 8) + 0x48))();
    if ((uVar1 & 1) == 0) {
      snprintf(painCave.errMsg,2000,
               "BoundaryElementModel::assignElements Error: No mesh was given as the shape\n");
      painCave.severity = 1;
      painCave.isFatal = 1;
      simError();
    }
    else {
      if (*(long *)(in_RDI + 8) != 0) {
        __dynamic_cast(*(long *)(in_RDI + 8),&Shape::typeinfo,&Mesh::typeinfo,0);
      }
      createTriangles(in_stack_000001c0,in_stack_000001b8);
    }
    local_8 = std::
              vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>::
              size((vector<OpenMD::HydrodynamicsElement,_std::allocator<OpenMD::HydrodynamicsElement>_>
                    *)(in_RDI + 0x10));
  }
  return local_8;
}

Assistant:

std::size_t BoundaryElementModel::assignElements() {
    if (shape_ != NULL) {
      if (shape_->isMesh()) {
        createTriangles(dynamic_cast<Mesh*>(shape_));
      } else {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "BoundaryElementModel::assignElements Error: No mesh was "
                 "given as the shape\n");
        painCave.severity = OPENMD_ERROR;
        painCave.isFatal  = 1;
        simError();
      }
      return elements_.size();
    }
    return 0;
  }